

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Builder.h
# Opt level: O1

void __thiscall arangodb::velocypack::Builder::addUInt(Builder *this,uint64_t v)

{
  ValueLength *pVVar1;
  ValueLength VVar2;
  
  if (v < 10) {
    reserve(this,1);
    VVar2 = this->_pos;
    this->_pos = VVar2 + 1;
    this->_start[VVar2] = (byte)v | 0x30;
    pVVar1 = &this->_bufferPtr->_size;
    *pVVar1 = *pVVar1 + 1;
    return;
  }
  appendUInt(this,v,'\'');
  return;
}

Assistant:

void addUInt(uint64_t v) {
    if (v <= 9) {
      // SmallInt
      appendByte(static_cast<uint8_t>(0x30 + v));
    } else {
      // regular UInt
      appendUInt(v, 0x27);
    }
  }